

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<kj::StringTree::Branch>::~Array(Array<kj::StringTree::Branch> *this)

{
  Array<kj::StringTree::Branch> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }